

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

void __thiscall NoiseSource::~NoiseSource(NoiseSource *this)

{
  ~NoiseSource((NoiseSource *)
               &this[-1].super_StochasticProcess.super_Physical.physicalUnit.nExpPrefix);
  return;
}

Assistant:

NoiseSource::~NoiseSource()
{
	// noises array
	for(int i=0; i<nNoises; ++i)
		if(aNoises[i])
			delete aNoises[i];
	delete[] aNoises;
	
	// mixing array
	for(int i=0; i<nNoises; i++)
		delete[] aA[i];
	delete[] aA;
	
	// omega array
	delete[] aOmega;
}